

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O1

void __thiscall CECorrections::copy_members(CECorrections *this,CECorrections *other)

{
  double dVar1;
  
  std::__cxx11::string::operator=((string *)&this->nutation_file_,(string *)&other->nutation_file_);
  std::vector<int,_std::allocator<int>_>::operator=(&this->nutation_mjd_,&other->nutation_mjd_);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->nutation_dut1_,&other->nutation_dut1_);
  std::vector<double,_std::allocator<double>_>::operator=(&this->nutation_xp_,&other->nutation_xp_);
  std::vector<double,_std::allocator<double>_>::operator=(&this->nutation_yp_,&other->nutation_yp_);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->nutation_deps_,&other->nutation_deps_);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->nutation_dpsi_,&other->nutation_dpsi_);
  std::__cxx11::string::operator=
            ((string *)&this->ttut1_file_hist_,(string *)&other->ttut1_file_hist_);
  std::__cxx11::string::operator=
            ((string *)&this->ttut1_file_pred_,(string *)&other->ttut1_file_pred_);
  std::vector<double,_std::allocator<double>_>::operator=(&this->ttut1_delt_,&other->ttut1_delt_);
  dVar1 = other->cache_nut_dut1_;
  this->cache_nut_mjd_ = other->cache_nut_mjd_;
  this->cache_nut_dut1_ = dVar1;
  dVar1 = other->cache_nut_yp_;
  this->cache_nut_xp_ = other->cache_nut_xp_;
  this->cache_nut_yp_ = dVar1;
  dVar1 = other->cache_nut_dpsi_;
  this->cache_nut_deps_ = other->cache_nut_deps_;
  this->cache_nut_dpsi_ = dVar1;
  dVar1 = other->cache_ttut1_delt_;
  this->cache_ttut1_mjd_ = other->cache_ttut1_mjd_;
  this->cache_ttut1_delt_ = dVar1;
  return;
}

Assistant:

void CECorrections::copy_members(const CECorrections& other)
{
    nutation_file_ = other.nutation_file_;
    nutation_mjd_  = other.nutation_mjd_;
    nutation_dut1_ = other.nutation_dut1_;
    nutation_xp_   = other.nutation_xp_;
    nutation_yp_   = other.nutation_yp_;
    nutation_deps_ = other.nutation_deps_;
    nutation_dpsi_ = other.nutation_dpsi_;

    ttut1_file_hist_ = other.ttut1_file_hist_;
    ttut1_file_pred_ = other.ttut1_file_pred_;
    ttut1_delt_      = other.ttut1_delt_;

    // Caching values
    cache_nut_mjd_    = other.cache_nut_mjd_;
    cache_nut_dut1_   = other.cache_nut_dut1_;
    cache_nut_xp_     = other.cache_nut_xp_;
    cache_nut_yp_     = other.cache_nut_yp_;
    cache_nut_deps_   = other.cache_nut_deps_;
    cache_nut_dpsi_   = other.cache_nut_dpsi_;
    cache_ttut1_mjd_  = other.cache_ttut1_mjd_;
    cache_ttut1_delt_ = other.cache_ttut1_delt_;
}